

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ref_phys.c
# Opt level: O0

REF_STATUS ref_phys_parse_tags(REF_DICT ref_dict,char *tags)

{
  int key;
  uint uVar1;
  char *__s;
  REF_STATUS ref_private_macro_code_rss;
  char *copy;
  char *token;
  REF_INT type;
  REF_INT id;
  char *tags_local;
  REF_DICT ref_dict_local;
  
  if (tags == (char *)0x0) {
    printf("%s: %d: %s: %s\n",
           "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_phys.c",0x1bc,
           "ref_phys_parse_tags","tags string is NULL");
    ref_dict_local._4_4_ = 2;
  }
  else {
    __s = strdup(tags);
    if (__s == (char *)0x0) {
      printf("%s: %d: %s: %s\n",
             "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_phys.c",0x1be,
             "ref_phys_parse_tags","tags copy is NULL");
      ref_dict_local._4_4_ = 2;
    }
    else {
      copy = strtok(__s,",");
      while (copy != (char *)0x0) {
        key = atoi(copy);
        uVar1 = ref_dict_store(ref_dict,key,4000);
        if (uVar1 != 0) {
          printf("%s: %d: %s: %d %s\n",
                 "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_phys.c",
                 0x1c3,"ref_phys_parse_tags",(ulong)uVar1,"store");
          return uVar1;
        }
        copy = strtok((char *)0x0,",");
      }
      free(__s);
      ref_dict_local._4_4_ = 0;
    }
  }
  return ref_dict_local._4_4_;
}

Assistant:

REF_FCN REF_STATUS ref_phys_parse_tags(REF_DICT ref_dict, const char *tags) {
  REF_INT id, type;
  char *token, *copy;
  RNS(tags, "tags string is NULL");
  copy = strdup(tags);
  RNS(copy, "tags copy is NULL");
  type = 4000;
  token = strtok(copy, ",");
  while (token != NULL) {
    id = atoi(token);
    RSS(ref_dict_store(ref_dict, id, type), "store");
    token = strtok(NULL, ",");
  }
  free(copy);

  return REF_SUCCESS;
}